

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HelpersTest.cpp
# Opt level: O2

void __thiscall AppHelper_Ofstream_Test::TestBody(AppHelper_Ofstream_Test *this)

{
  ostream *poVar1;
  char *in_R9;
  AssertHelper local_290;
  AssertHelper local_288;
  AssertionResult gtest_ar_;
  TempFile myfile;
  string local_250;
  string name;
  ofstream out;
  size_type local_208;
  
  std::__cxx11::string::string((string *)&name,"TestFileNotUsed.txt",(allocator *)&out);
  std::__cxx11::string::string((string *)&local_250,(string *)&name);
  TempFile::TempFile(&myfile,&local_250);
  std::__cxx11::string::~string((string *)&local_250);
  std::ofstream::ofstream(&out,(string *)&myfile,_S_out);
  poVar1 = std::operator<<((ostream *)&out,"this is output");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::ofstream::~ofstream(&out);
  CLI::ExistingFile((string *)&out,&myfile._name);
  gtest_ar_.success_ = local_208 == 0;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  std::__cxx11::string::~string((string *)&out);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&local_290);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&out,(internal *)&gtest_ar_,
               (AssertionResult *)"CLI::ExistingFile(myfile).empty()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_288,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/HelpersTest.cpp"
               ,0xad,_out);
    testing::internal::AssertHelper::operator=(&local_288,(Message *)&local_290);
    testing::internal::AssertHelper::~AssertHelper(&local_288);
    std::__cxx11::string::~string((string *)&out);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_290);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  TempFile::~TempFile(&myfile);
  CLI::ExistingFile((string *)&out,&name);
  myfile._name._M_dataplus._M_p._0_1_ = local_208 != 0;
  myfile._name._M_string_length = 0;
  std::__cxx11::string::~string((string *)&out);
  if (local_208 == 0) {
    testing::Message::Message((Message *)&gtest_ar_);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&out,(internal *)&myfile,
               (AssertionResult *)"CLI::ExistingFile(name).empty()","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_290,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/HelpersTest.cpp"
               ,0xaf,_out);
    testing::internal::AssertHelper::operator=(&local_290,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper(&local_290);
    std::__cxx11::string::~string((string *)&out);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&myfile._name._M_string_length);
  std::__cxx11::string::~string((string *)&name);
  return;
}

Assistant:

TEST(AppHelper, Ofstream) {

    std::string name = "TestFileNotUsed.txt";
    {
        TempFile myfile(name);

        {
            std::ofstream out{myfile};
            out << "this is output" << std::endl;
        }

        EXPECT_TRUE(CLI::ExistingFile(myfile).empty());
    }
    EXPECT_FALSE(CLI::ExistingFile(name).empty());
}